

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.hpp
# Opt level: O0

ostream * operator<<(ostream *os,
                    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *property)

{
  type *ptVar1;
  ostream *poVar2;
  type *ptVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *property_local;
  ostream *os_local;
  
  ptVar1 = std::get<0ul,std::__cxx11::string_const,std::__cxx11::string>(property);
  poVar2 = std::operator<<(os,(string *)ptVar1);
  poVar2 = std::operator<<(poVar2," = ");
  ptVar3 = std::get<1ul,std::__cxx11::string_const,std::__cxx11::string>(property);
  std::operator<<(poVar2,(string *)ptVar3);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::pair<const std::string, std::string> &property) {
  os << std::get<0>(property) << " = " << std::get<1>(property);
  return os;
}